

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::apply
          (SWAP<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  anon_class_8_1_703dd281_conflict1 f;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281_conflict1 local_40;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (&local_38,this);
  iVar1 = *local_38._M_impl.super__Vector_impl_data._M_start;
  *local_38._M_impl.super__Vector_impl_data._M_start = iVar1 + offset;
  iVar2 = local_38._M_impl.super__Vector_impl_data._M_start[1];
  local_38._M_impl.super__Vector_impl_data._M_start[1] = offset + iVar2;
  local_40.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  apply4bc<qclab::qgates::lambda_SWAP<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }